

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_3e8f::test_xor(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *r_00;
  roaring64_bitmap_t *r_01;
  
  r = roaring64_bitmap_create();
  r_00 = roaring64_bitmap_create();
  roaring64_bitmap_add(r,100000);
  roaring64_bitmap_add(r,0x186a1);
  roaring64_bitmap_add(r,200000);
  roaring64_bitmap_add(r,300000);
  roaring64_bitmap_add(r_00,0x186a1);
  roaring64_bitmap_add(r_00,200000);
  roaring64_bitmap_add(r_00,400000);
  r_01 = roaring64_bitmap_xor(r,r_00);
  assert_r64_valid((roaring64_bitmap_t *)r_01);
  _Var1 = roaring64_bitmap_contains(r_01,100000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r3, 100000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x4ee);
  _Var1 = roaring64_bitmap_contains(r_01,0x186a1);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains(r3, 100001)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x4ef);
  _Var1 = roaring64_bitmap_contains(r_01,200000);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains(r3, 200000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x4f0);
  _Var1 = roaring64_bitmap_contains(r_01,300000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r3, 300000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x4f1);
  _Var1 = roaring64_bitmap_contains(r_01,400000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r3, 400000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x4f2);
  roaring64_bitmap_free(r);
  roaring64_bitmap_free(r_00);
  roaring64_bitmap_free(r_01);
  return;
}

Assistant:

DEFINE_TEST(test_xor) {
    roaring64_bitmap_t* r1 = roaring64_bitmap_create();
    roaring64_bitmap_t* r2 = roaring64_bitmap_create();

    roaring64_bitmap_add(r1, 100000);
    roaring64_bitmap_add(r1, 100001);
    roaring64_bitmap_add(r1, 200000);
    roaring64_bitmap_add(r1, 300000);

    roaring64_bitmap_add(r2, 100001);
    roaring64_bitmap_add(r2, 200000);
    roaring64_bitmap_add(r2, 400000);

    roaring64_bitmap_t* r3 = roaring64_bitmap_xor(r1, r2);

    assert_r64_valid(r3);
    assert_true(roaring64_bitmap_contains(r3, 100000));
    assert_false(roaring64_bitmap_contains(r3, 100001));
    assert_false(roaring64_bitmap_contains(r3, 200000));
    assert_true(roaring64_bitmap_contains(r3, 300000));
    assert_true(roaring64_bitmap_contains(r3, 400000));

    roaring64_bitmap_free(r1);
    roaring64_bitmap_free(r2);
    roaring64_bitmap_free(r3);
}